

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O2

bool __thiscall
testing::internal::HasSubstrMatcher<std::__cxx11::string>::MatchAndExplain<std::__cxx11::string>
          (HasSubstrMatcher<std::__cxx11::string> *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s,
          MatchResultListener *param_2)

{
  long lVar1;
  string local_30 [32];
  
  std::__cxx11::string::string(local_30,(string *)s);
  lVar1 = std::__cxx11::string::find(local_30,(ulong)this);
  std::__cxx11::string::~string(local_30);
  return lVar1 != -1;
}

Assistant:

bool MatchAndExplain(const MatcheeStringType& s,
                       MatchResultListener* /* listener */) const {
    return StringType(s).find(substring_) != StringType::npos;
  }